

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O1

void consume<long,disruptor::SingleThreadedStrategy,disruptor::YieldingStrategy<200l>>
               (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
                *s,Sequence *seq)

{
  bool bVar1;
  int64_t iVar2;
  ulong uVar3;
  long lVar4;
  unique_ptr<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>,_std::default_delete<disruptor::SequenceBarrier<disruptor::YieldingStrategy<200L>_>_>_>
  barrier;
  int64_t next_seq;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> depseqs;
  undefined8 *local_60;
  ulong local_58;
  duration<long,_std::ratio<1L,_1000000L>_> local_50;
  void *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_48 = (void *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  disruptor::
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>::
  NewBarrier((Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::YieldingStrategy<200L>,_64>
              *)&local_60,(vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)s
            );
  local_58 = 0;
  lVar4 = 0;
  do {
    local_50.__r = 10000;
    iVar2 = disruptor::YieldingStrategy<200l>::WaitFor<long,std::ratio<1l,1000000l>>
                      ((YieldingStrategy<200l> *)*local_60,(int64_t *)&local_58,
                       (Sequence *)local_60[1],
                       (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
                       (local_60 + 2),(atomic<bool> *)(local_60 + 5),&local_50);
    uVar3 = local_58;
    if (iVar2 < (long)local_58) {
LAB_001247d8:
      local_58 = uVar3;
      bVar1 = false;
    }
    else {
      do {
        lVar4 = lVar4 + (s->ring_buffer_).events_.
                        super__Vector_base<disruptor::RingBuffer<long,_64>::AlignedElement,_std::allocator<disruptor::RingBuffer<long,_64>::AlignedElement>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [uVar3 & (long)(s->ring_buffer_).index_mask_].elem_;
        uVar3 = uVar3 + 1;
      } while (iVar2 + 1U != uVar3);
      (seq->sequence_).super___atomic_base<long>._M_i = iVar2;
      bVar1 = true;
      uVar3 = iVar2 + 1U;
      if (iVar2 != expectedValue) goto LAB_001247d8;
    }
    if (bVar1) {
      LOCK();
      sum.super___atomic_base<long>._M_i =
           (__atomic_base<long>)((long)sum.super___atomic_base<long>._M_i + lVar4);
      UNLOCK();
      if (local_60 != (undefined8 *)0x0) {
        if ((void *)local_60[2] != (void *)0x0) {
          operator_delete((void *)local_60[2]);
        }
        operator_delete(local_60);
      }
      if (local_48 != (void *)0x0) {
        operator_delete(local_48);
      }
      return;
    }
  } while( true );
}

Assistant:

void consume(disruptor::Sequencer<T, C, W, Alignment>& s, disruptor::Sequence& seq) {
  std::vector<disruptor::Sequence*> depseqs;
  auto barrier = s.NewBarrier(depseqs);

  int64_t next_seq = disruptor::kFirstSequenceValue;

  int exitCtr = 0;
  int64_t localSum = 0;

  while (true) {
#ifdef PRINT_DEBUG_CONS
    std::stringstream ss;
    ss << "Wait for next seq: " << next_seq << ' ' << std::this_thread::get_id()
       << '\n';
    std::cout << ss.str();
#endif

    int64_t available_seq =
        barrier->WaitFor(next_seq, std::chrono::microseconds(10000));

#ifdef PRINT_DEBUG_CONS
    ss.clear();
    ss.str(std::string());
    ss << "Available seq: " << available_seq << ' '
       << std::this_thread::get_id() << '\n';
    std::cout << ss.str();
#endif

    if (available_seq < next_seq) continue;

    // Only required for claim strategy MultiThreadedStrategyEx as it changes
    // the cursor.
    available_seq = s.GetHighestPublishedSequence(next_seq, available_seq);
    if (available_seq < next_seq) {
      ++exitCtr;

#ifdef PRINT_DEBUG_CONS
      ss.clear();
      ss.str(std::string());
      ss << "Highest published seq: " << available_seq << ' '
         << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
      // Otherwise goes into a busy loop with blocking strategy
      if (exitCtr > 10)
        std::this_thread::sleep_for(std::chrono::microseconds(1));
      continue;
    }

    for (int64_t i = next_seq; i <= available_seq; ++i) {
      int64_t ev = s[i];
#ifdef PRINT_DEBUG_CONS
      std::cout << i << " Event: " << ev << '\n';
#endif
      localSum += ev;
    }

    seq.set_sequence(available_seq);

    if (available_seq == expectedValue) break;

    next_seq = available_seq + 1;

    exitCtr = 0;
  }

  sum.fetch_add(localSum, std::memory_order_relaxed);
}